

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImBitVector::Create(ImBitVector *this,int sz)

{
  uint *__src;
  uint *__dest;
  int iVar1;
  int iVar2;
  
  iVar1 = sz + 0x1f >> 5;
  iVar2 = (this->Storage).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar2 / 2 + iVar2;
    }
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
    __dest = (uint *)ImGui::MemAlloc((long)iVar2 << 2);
    __src = (this->Storage).Data;
    if (__src != (uint *)0x0) {
      memcpy(__dest,__src,(long)(this->Storage).Size << 2);
      ImGui::MemFree((this->Storage).Data);
    }
    (this->Storage).Data = __dest;
    (this->Storage).Capacity = iVar2;
  }
  else {
    __dest = (this->Storage).Data;
  }
  (this->Storage).Size = iVar1;
  memset(__dest,0,(long)iVar1 << 2);
  return;
}

Assistant:

void            Create(int sz)              { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }